

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeCube>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long lVar4;
  long *plVar5;
  pair<int,_long> *ppVar6;
  ostream *poVar7;
  void *this;
  long in_RDI;
  int ivs;
  int maxd_1;
  int maxd;
  int d_1;
  int include_1;
  int shord [3];
  int maxorder [3];
  int sidedimension_1;
  int ish_1;
  int lastshape_1;
  int firstshape_1;
  MElementType tipo;
  int dir;
  int bil;
  int side_2;
  int ivec_1;
  int locvec_1;
  int d;
  int include;
  int sidedimension;
  int ish;
  int lastshape;
  int firstshape;
  int order;
  int connectindex;
  int face;
  int side_1;
  int ivec;
  int locvec;
  int firstface;
  int64_t nvec;
  TPZManVector<long,_27> FirstIndex;
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  int i;
  int counthold;
  TPZManVector<int,_27> permgather;
  int nlowdim;
  TPZStack<int,_10> smallsides;
  int side;
  int count;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_10> facevector;
  int nexternalvectors;
  int nshape;
  int pressureorder;
  TPZManVector<int,_81> normalsides;
  TPZManVector<int,_81> directions;
  TPZManVector<int,_81> bilinear;
  TPZManVector<int,_81> VectorSides;
  int64_t numvec;
  int *in_stack_fffffffffffff448;
  TPZManVector<int,_81> *in_stack_fffffffffffff450;
  TPZGenMatrix<int> *in_stack_fffffffffffff458;
  TPZStack<int,_10> *in_stack_fffffffffffff460;
  TPZVec<int> *in_stack_fffffffffffff468;
  TPZManVector<int,_81> *in_stack_fffffffffffff470;
  TPZVec<int> *in_stack_fffffffffffff478;
  TPZManVector<int,_10> *in_stack_fffffffffffff480;
  TPZGenMatrix<int> *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4cc;
  TPZVec<long> *in_stack_fffffffffffff4d0;
  TPZVec<int> *in_stack_fffffffffffff4e0;
  TPZShapeData *in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  pair<int,_int> local_a2c;
  int local_a24;
  int local_a20;
  int local_a1c;
  int local_a18;
  int local_a14 [4];
  int local_a04;
  int local_a00;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  MElementType local_9ec;
  int local_9e8;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  pair<int,_int> local_9d4;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  undefined4 local_99c;
  int64_t local_998;
  TPZVec<long> local_990 [7];
  int local_894;
  int local_878;
  int local_874;
  TPZVec<int> local_870 [4];
  int local_7dc;
  TPZVec<int> local_7d8 [2];
  size_t in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  int iVar8;
  undefined4 in_stack_fffffffffffff874;
  int iVar9;
  TPZVec<int> local_788 [11];
  undefined4 local_61c;
  TPZVec<int> local_618 [2];
  int local_5cc;
  int local_5c8;
  int local_5c4;
  TPZVec<int> local_458 [11];
  TPZVec<int> local_2e0 [11];
  TPZVec<int> local_178 [11];
  undefined8 local_10;
  long local_8;
  
  local_10 = 0x51;
  local_8 = in_RDI;
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468);
  pztopology::TPZCube::GetSideHDivDirections
            (&in_stack_fffffffffffff480->super_TPZVec<int>,in_stack_fffffffffffff478,
             &in_stack_fffffffffffff470->super_TPZVec<int>,in_stack_fffffffffffff468);
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar2 == 0) {
    pzinternal::DebugStopImpl
              ((char *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               in_stack_fffffffffffff868);
  }
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),6);
  local_5c4 = *piVar3;
  local_5c8 = pzshape::TPZShapeCube::NShapeF(&in_stack_fffffffffffff450->super_TPZVec<int>);
  local_5cc = 0;
  TPZVec<int>::size(local_178);
  local_61c = 0x1a;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffff480,(int64_t)in_stack_fffffffffffff478,
             (int *)in_stack_fffffffffffff470);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468);
  iVar9 = 0;
  for (iVar8 = 0; iVar1 = iVar9, iVar8 < 0x1b; iVar8 = iVar8 + 1) {
    iVar1 = pztopology::TPZCube::SideDimension(0x18ae4e0);
    if (iVar1 == 2) {
      TPZStack<int,_10>::TPZStack(in_stack_fffffffffffff460);
      pztopology::TPZCube::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff460 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff458);
      iVar2 = TPZVec<int>::NElements(local_7d8);
      local_7dc = (int)iVar2 + 1;
      TPZManVector<int,_27>::TPZManVector
                ((TPZManVector<int,_27> *)in_stack_fffffffffffff470,
                 (int64_t)in_stack_fffffffffffff468);
      HDivPermutation((int)((ulong)in_stack_fffffffffffff4f0 >> 0x20),in_stack_fffffffffffff4e8,
                      in_stack_fffffffffffff4e0);
      local_874 = iVar9;
      iVar9 = local_874;
      for (local_878 = 0; local_878 < local_7dc; local_878 = local_878 + 1) {
        piVar3 = TPZVec<int>::operator[](local_870,(long)local_878);
        iVar1 = *piVar3 + local_874;
        piVar3 = TPZVec<int>::operator[](local_788,(long)(local_874 + local_878));
        *piVar3 = iVar1;
        iVar1 = iVar8;
        piVar3 = TPZVec<int>::operator[](local_618,(long)iVar9);
        *piVar3 = iVar8;
        iVar9 = iVar9 + 1;
        iVar8 = iVar1;
      }
      TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)in_stack_fffffffffffff450);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18ae703);
    }
  }
  while (local_5cc = iVar1, lVar4 = (long)iVar9, iVar2 = TPZVec<int>::size(local_788), lVar4 < iVar2
        ) {
    iVar1 = iVar9;
    piVar3 = TPZVec<int>::operator[](local_788,(long)iVar9);
    *piVar3 = iVar9;
    iVar9 = iVar1 + 1;
    iVar1 = local_5cc;
  }
  TPZGenMatrix<int>::TPZGenMatrix
            ((TPZGenMatrix<int> *)in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
             (int64_t)in_stack_fffffffffffff460);
  pzshape::TPZShapeCube::ShapeOrder
            (in_stack_fffffffffffff4d0,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             in_stack_fffffffffffff4c0);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),6);
  local_894 = *piVar3 + 1;
  TPZManVector<long,_27>::TPZManVector
            ((TPZManVector<long,_27> *)in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468)
  ;
  FirstShapeIndex((TPZVec<long> *)in_stack_fffffffffffff470,(int *)in_stack_fffffffffffff468);
  local_998 = TPZVec<int>::NElements(local_178);
  iVar9 = 0;
  local_99c = 0x14;
  for (local_9a0 = 0; local_9a0 < local_5cc; local_9a0 = local_9a0 + 1) {
    piVar3 = TPZVec<int>::operator[](local_788,(long)local_9a0);
    local_9a4 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_178,(long)local_9a4);
    local_9a8 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_618,(long)local_9a0);
    local_9ac = *piVar3;
    local_9b0 = local_9ac + -0x14;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),(long)local_9b0);
    local_9b4 = *piVar3;
    plVar5 = TPZVec<long>::operator[](local_990,(long)local_9a8);
    local_9b8 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_990,(long)(local_9a8 + 1));
    local_9bc = (int)*plVar5;
    for (local_9c0 = local_9b8; local_9c0 < local_9bc; local_9c0 = local_9c0 + 1) {
      local_9c4 = pztopology::TPZCube::SideDimension(0x18aea2a);
      local_9c8 = 1;
      for (local_9cc = 0; local_9cc < local_9c4; local_9cc = local_9cc + 1) {
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                            (int64_t)in_stack_fffffffffffff448);
        if (local_9b4 < *piVar3) {
          local_9c8 = 0;
        }
      }
      if (local_9c8 != 0) {
        local_9d4 = std::make_pair<int&,int&>(in_stack_fffffffffffff448,(int *)0x18aeb28);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_9d4);
        iVar9 = iVar9 + 1;
      }
    }
  }
  for (local_9d8 = local_5cc; local_9d8 < local_998; local_9d8 = local_9d8 + 1) {
    piVar3 = TPZVec<int>::operator[](local_788,(long)local_9d8);
    local_9dc = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_178,(long)local_9dc);
    local_9e0 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_2e0,(long)local_9dc);
    local_9e4 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_458,(long)local_9dc);
    local_9e8 = *piVar3;
    local_9ec = pztopology::TPZCube::Type(local_9e0);
    plVar5 = TPZVec<long>::operator[](local_990,(long)local_9e0);
    local_9f0 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_990,(long)(local_9e0 + 1));
    local_9f4 = (int)*plVar5;
    for (local_9f8 = local_9f0; local_9f8 < local_9f4; local_9f8 = local_9f8 + 1) {
      local_9fc = pztopology::TPZCube::SideDimension(0x18aed4e);
      local_a14[3] = local_5c4;
      local_a04 = local_5c4;
      local_a00 = local_5c4;
      if (local_9e4 != 0) {
        local_a14[(long)local_9e8 + 3] = local_a14[(long)local_9e8 + 3] + 1;
      }
      memset(local_a14,0,0xc);
      local_a18 = 1;
      for (local_a1c = 0; local_a1c < local_9fc; local_a1c = local_a1c + 1) {
        if ((local_9ec == ETriangle) || (local_9ec == ETetraedro)) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                              (int64_t)in_stack_fffffffffffff448);
          local_a14[local_a1c] = *piVar3;
          local_a20 = local_a14[(long)local_a1c + 3] + 1;
          if (local_a20 < local_a14[local_a1c]) {
            local_a18 = 0;
          }
        }
        else if (local_9ec == EQuadrilateral) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                              (int64_t)in_stack_fffffffffffff448);
          local_a14[local_a1c] = *piVar3;
          local_a24 = local_a14[(long)local_a1c + 3];
          if (local_a24 < local_a14[local_a1c]) {
            local_a18 = 0;
          }
        }
        else if (local_9ec == ECube) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                              (int64_t)in_stack_fffffffffffff448);
          local_a14[local_a1c] = *piVar3;
          if (local_a14[(long)local_a1c + 3] < local_a14[local_a1c]) {
            local_a18 = 0;
          }
        }
        else if (local_9ec == EPrisma) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                              (int64_t)in_stack_fffffffffffff448);
          if (local_a14[(long)local_a1c + 3] < *piVar3) {
            local_a18 = 0;
          }
        }
        else if (local_9ec == EOned) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                              (int64_t)in_stack_fffffffffffff448);
          local_a14[0] = *piVar3;
          if (local_a14[(long)local_a1c + 3] < *piVar3) {
            local_a18 = 0;
          }
        }
        else if (local_9ec == EPiramide) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff458,(int64_t)in_stack_fffffffffffff450,
                              (int64_t)in_stack_fffffffffffff448);
          local_a14[local_a1c] = *piVar3;
          if (local_a14[(long)local_a1c + 3] < local_a14[local_a1c]) {
            local_a18 = 0;
          }
        }
        else {
          pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffff868);
        }
      }
      if (local_a18 != 0) {
        local_a2c = std::make_pair<int&,int&>(in_stack_fffffffffffff448,(int *)0x18af0ec);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_a2c);
        iVar9 = iVar9 + 1;
      }
    }
  }
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar9 != (int)iVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,"count ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
    in_stack_fffffffffffff450 = (TPZManVector<int,_81> *)std::operator<<(poVar7,"\nivs ");
    this = (void *)std::ostream::operator<<(in_stack_fffffffffffff450,(int)iVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffff868);
  }
  TPZManVector<long,_27>::~TPZManVector((TPZManVector<long,_27> *)in_stack_fffffffffffff450);
  TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffff450);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff450);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffff450);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff450);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff450);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff450);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff450);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}